

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_> *
__thiscall
kratos::Generator::get_child_generators
          (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *__return_storage_ptr__,Generator *this)

{
  bool bVar1;
  size_type __n;
  reference __k;
  mapped_type *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Generator *this_local;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *result;
  
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  vector(__return_storage_ptr__);
  if ((this->is_external_ & 1U) == 0) {
    __n = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
          ::size(&this->children_);
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::reserve(__return_storage_ptr__,__n);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->children_names_);
    n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->children_names_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&n), bVar1) {
      __k = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
      __args = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
               ::at(&this->children_,__k);
      std::
      vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
      ::emplace_back<std::shared_ptr<kratos::Generator>&>
                ((vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>
                  *)__return_storage_ptr__,__args);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Generator>> Generator::get_child_generators() {
    std::vector<std::shared_ptr<Generator>> result;
    if (is_external_) return result;
    result.reserve(children_.size());
    for (auto const &n : children_names_) {
        result.emplace_back(children_.at(n));
    }
    return result;
}